

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::DiffuseBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,DiffuseBxDF *this)

{
  float *unaff_RBX;
  
  StringPrintf<pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ DiffuseBxDF R: %s T: %s A: %f B: %f ]",(char *)this,
             &this->T,(SampledSpectrum *)&this->A,&this->B,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string DiffuseBxDF::ToString() const {
    return StringPrintf("[ DiffuseBxDF R: %s T: %s A: %f B: %f ]", R, T, A, B);
}